

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

bool Fossilize::find_layer
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *layers,char *layer)

{
  int iVar1;
  long lVar2;
  long lVar3;
  pointer *ppVVar4;
  pointer *ppVVar5;
  
  lVar2 = (long)layer - (long)layers;
  lVar3 = (lVar2 >> 3) * 0xfc0fc0fc0fc0fc1 >> 2;
  if (0 < lVar3) {
    ppVVar5 = (pointer *)(lVar3 * 0x820 + (long)layers);
    lVar3 = lVar3 + 1;
    do {
      iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)layers);
      ppVVar4 = (pointer *)layers;
      if (iVar1 == 0) goto LAB_001722e5;
      iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)((long)layers + 0x208));
      ppVVar4 = (pointer *)((long)layers + 0x208);
      if (iVar1 == 0) goto LAB_001722e5;
      iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)((long)layers + 0x410));
      ppVVar4 = (pointer *)((long)layers + 0x410);
      if (iVar1 == 0) goto LAB_001722e5;
      iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)((long)layers + 0x618));
      ppVVar4 = (pointer *)((long)layers + 0x618);
      if (iVar1 == 0) goto LAB_001722e5;
      layers = (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
               ((long)layers + 0x820);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
    lVar2 = (long)layer - (long)ppVVar5;
    layers = (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)ppVVar5;
  }
  lVar2 = (lVar2 >> 3) * 0xfc0fc0fc0fc0fc1;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      ppVVar4 = (pointer *)layer;
      if ((lVar2 != 3) ||
         (iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)layers), ppVVar4 = (pointer *)layers,
         iVar1 == 0)) goto LAB_001722e5;
      layers = (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
               ((long)layers + 0x208);
    }
    iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)layers);
    ppVVar4 = (pointer *)layers;
    if (iVar1 == 0) goto LAB_001722e5;
    layers = (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)((long)layers + 0x208)
    ;
  }
  iVar1 = strcmp("VK_LAYER_KHRONOS_validation",(char *)layers);
  ppVVar4 = (pointer *)layers;
  if (iVar1 != 0) {
    ppVVar4 = (pointer *)layer;
  }
LAB_001722e5:
  return ppVVar4 != (pointer *)layer;
}

Assistant:

static bool find_layer(const vector<VkLayerProperties> &layers, const char *layer)
{
	auto itr = find_if(begin(layers), end(layers), [&](const VkLayerProperties &prop) -> bool {
		return strcmp(layer, prop.layerName) == 0;
	});
	return itr != end(layers);
}